

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O1

dev_t pack_native(int n,u_long *numbers,char **error)

{
  ulong uVar1;
  char *pcVar2;
  uint uVar3;
  
  if (n == 2) {
    uVar3 = (uint)numbers[1] & 0xffff00ff;
    uVar1 = (ulong)(((uint)*numbers & 0xff) << 8 | uVar3);
    if (*numbers < 0x100) {
      if ((long)(int)uVar3 == numbers[1]) {
        return uVar1;
      }
      pcVar2 = "invalid minor number";
    }
    else {
      pcVar2 = "invalid major number";
    }
  }
  else {
    pcVar2 = "too many fields for format";
    uVar1 = 0;
  }
  *error = pcVar2;
  return uVar1;
}

Assistant:

dev_t
pack_native(int n, u_long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = apd_makedev(numbers[0], numbers[1]);
		if ((u_long)major(dev) != numbers[0])
			*error = iMajorError;
		else if ((u_long)minor(dev) != numbers[1])
			*error = iMinorError;
	} else
		*error = tooManyFields;
	return (dev);
}